

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O1

void Assimp::Bitmap::Save(aiTexture *texture,IOStream *file)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined2 local_58;
  undefined4 uStack_56;
  undefined2 uStack_52;
  uint uStack_50;
  undefined2 uStack_4c;
  undefined6 uStack_4a;
  int local_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (file != (IOStream *)0x0) {
    uVar1 = texture->mWidth;
    uVar2 = texture->mHeight;
    iVar3 = (uVar1 * 4 & 0xffff) * uVar2;
    uStack_56 = iVar3 + 0x36;
    local_58 = 0x4d42;
    uStack_52 = 0;
    uStack_50 = 0x360000;
    uStack_4c = 0;
    (*file->_vptr_IOStream[3])(file,&local_58,0xe,1);
    local_58 = 0x28;
    uStack_56._0_2_ = 0;
    uStack_56._2_2_ = (undefined2)uVar1;
    uStack_52 = (undefined2)(uVar1 >> 0x10);
    uStack_4c = 1;
    uStack_4a = 0x20;
    local_40 = 0;
    uStack_38 = 0;
    uStack_50 = uVar2;
    local_44 = iVar3;
    (*file->_vptr_IOStream[3])(file,&local_58,0x28,1);
    WriteData(texture,file);
  }
  return;
}

Assistant:

void Bitmap::Save(aiTexture* texture, IOStream* file) {
        if(file != NULL) {
            Header header;
            DIB dib;

            dib.size = DIB::dib_size;
            dib.width = texture->mWidth;
            dib.height = texture->mHeight;
            dib.planes = 1;
            dib.bits_per_pixel = 8 * mBytesPerPixel;
            dib.compression = 0;
            dib.image_size = (((dib.width * mBytesPerPixel) + 3) & 0x0000FFFC) * dib.height;
            dib.x_resolution = 0;
            dib.y_resolution = 0;
            dib.nb_colors = 0;
            dib.nb_important_colors = 0;

            header.type = 0x4D42; // 'BM'
            header.offset = Header::header_size + DIB::dib_size;
            header.size = header.offset + dib.image_size;
            header.reserved1 = 0;
            header.reserved2 = 0;

            WriteHeader(header, file);
            WriteDIB(dib, file);
            WriteData(texture, file);
        }
    }